

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O0

void __thiscall higan::HttpRequest::HttpRequest(HttpRequest *this)

{
  HttpRequest *this_local;
  
  this->method_ = HTTP_REQUEST_UNKNOWN;
  std::__cxx11::string::string((string *)&this->url_);
  this->version_ = HTTP_VERSION_UNKNOWN;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->headers_);
  Buffer::Buffer(&this->body_);
  return;
}

Assistant:

HttpRequest::HttpRequest():
		method_(HTTP_REQUEST_UNKNOWN),
		url_(),
		version_(HTTP_VERSION_UNKNOWN)
{

}